

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_compress_image(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  fitsfile *fptr;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double *nullflagval;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  FITSfile *tileny;
  size_t __size;
  char *err_message;
  long lVar17;
  int iVar18;
  int iVar19;
  int local_258;
  int anynul;
  double *local_250;
  fitsfile *local_248;
  int local_23c;
  fitsfile *local_238;
  long local_230;
  ulong local_228;
  float fltnull;
  long naxes [6];
  long lpixel [6];
  long fpixel [6];
  double dblnull;
  double dummy;
  long local_118 [6];
  long tilesize [6];
  long alStack_b8 [5];
  long local_90;
  char card [81];
  
  dummy = 0.0;
  dblnull = -9.1191291391491e-36;
  fltnull = -9.11912e-36;
  local_118[0] = 1;
  local_118[1] = 1;
  local_118[2] = 1;
  local_118[3] = 1;
  local_118[4] = 1;
  local_118[5] = 1;
  iVar18 = *status;
  if (0 < iVar18) {
    return iVar18;
  }
  tileny = outfptr->Fptr;
  __size = tileny->maxtilelen;
  iVar19 = tileny->zbitpix;
  if (iVar19 == -0x20) {
    if (tileny->compress_type == 0x29) {
      iVar5 = 3;
    }
    else {
      iVar5 = 2;
    }
    local_258 = 0x2a;
    bVar9 = false;
LAB_001c68d1:
    bVar6 = false;
LAB_001c68d9:
    __size = __size << iVar5;
    bVar7 = false;
  }
  else {
    if (iVar19 < 0x10) {
      if (iVar19 != -0x40) {
        if (iVar19 != 8) {
LAB_001c6fa4:
          ffpmsg("Bad image datatype. (imcomp_compress_image)");
          *status = 0x71;
          return 0x71;
        }
        local_258 = 0xb;
        bVar8 = true;
        if ((0x33 < (ulong)(uint)tileny->compress_type) ||
           ((0x8000000600800U >> ((ulong)(uint)tileny->compress_type & 0x3f) & 1) == 0)) {
          __size = __size << 2;
        }
        bVar9 = false;
        bVar6 = false;
        bVar7 = false;
        goto LAB_001c68e9;
      }
      iVar5 = 3;
      local_258 = 0x52;
      bVar9 = true;
      goto LAB_001c68d1;
    }
    if (iVar19 != 0x10) {
      if (iVar19 != 0x20) goto LAB_001c6fa4;
      if (tileny->compress_type == 0x29) {
        iVar5 = 3;
      }
      else {
        iVar5 = 2;
      }
      local_258 = 0x1f;
      bVar6 = true;
      bVar9 = false;
      goto LAB_001c68d9;
    }
    uVar10 = tileny->compress_type + 1;
    if ((uVar10 < 0x35) && ((0x10000000c01001U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
      __size = __size * 2;
    }
    else {
      __size = __size << 2;
    }
    local_258 = 0x15;
    bVar7 = true;
    bVar9 = false;
    bVar6 = false;
  }
  bVar8 = false;
LAB_001c68e9:
  local_250 = (double *)malloc(__size);
  if (local_250 == (double *)0x0) {
    ffpmsg("Out of memory. (imcomp_compress_image)");
    *status = 0x71;
    return 0x71;
  }
  uVar10 = tileny->zndim;
  lVar11 = 0;
  do {
    lVar13 = 1;
    lVar15 = 1;
    if (lVar11 < (int)uVar10) {
      lVar15 = tileny->tilesize[lVar11];
      lVar13 = tileny->znaxis[lVar11];
    }
    naxes[lVar11] = lVar13;
    tilesize[lVar11] = lVar15;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  local_248 = infptr;
  local_23c = iVar19;
  if (naxes[5] < 1) {
    free(local_250);
    return iVar18;
  }
  local_228 = 0;
  local_230 = 1;
  lVar11 = naxes[4];
  lVar15 = naxes[5];
  lVar13 = 1;
  local_238 = outfptr;
  do {
    fpixel[5] = lVar13;
    lVar17 = lVar13 + tilesize[5];
    lpixel[5] = tilesize[5] + -1 + lVar13;
    if (lVar15 < lVar17) {
      lpixel[5] = lVar15;
    }
    local_90 = (lpixel[5] - lVar13) + 1;
    if (0 < lVar11) {
      lVar13 = naxes[3];
      lVar16 = 1;
      do {
        fpixel[4] = lVar16;
        lVar1 = tilesize[4] + lVar16;
        lpixel[4] = tilesize[4] + -1 + lVar16;
        if (lVar11 < lVar1) {
          lpixel[4] = lVar11;
        }
        alStack_b8[4] = (lpixel[4] - lVar16) + 1;
        if (0 < lVar13) {
          lVar15 = naxes[2];
          lVar16 = 1;
          do {
            fpixel[3] = lVar16;
            lVar2 = tilesize[3] + lVar16;
            lpixel[3] = tilesize[3] + -1 + lVar16;
            if (lVar13 < lVar2) {
              lpixel[3] = lVar13;
            }
            alStack_b8[3] = (lpixel[3] - lVar16) + 1;
            if (0 < lVar15) {
              lVar11 = naxes[1];
              lVar16 = 1;
              do {
                fpixel[2] = lVar16;
                lVar3 = tilesize[2] + lVar16;
                lpixel[2] = tilesize[2] + -1 + lVar16;
                if (lVar15 < lVar3) {
                  lpixel[2] = lVar15;
                }
                alStack_b8[2] = (lpixel[2] - lVar16) + 1;
                if (0 < lVar11) {
                  lVar13 = naxes[0];
                  lVar16 = 1;
                  do {
                    fpixel[1] = lVar16;
                    lVar4 = tilesize[1] + lVar16;
                    lpixel[1] = tilesize[1] + -1 + lVar16;
                    if (lVar11 < lVar4) {
                      lpixel[1] = lVar11;
                    }
                    alStack_b8[1] = (lpixel[1] - lVar16) + 1;
                    if (0 < lVar13) {
                      lVar15 = 1;
                      do {
                        lVar16 = tilesize[0] + lVar15;
                        lpixel[0] = tilesize[0] + -1 + lVar15;
                        if (lVar13 < lVar16) {
                          lpixel[0] = lVar13;
                        }
                        lVar11 = (lpixel[0] - lVar15) + 1;
                        fpixel[0] = lVar15;
                        if (1 < (int)uVar10) {
                          lVar15 = 1;
                          do {
                            lVar11 = lVar11 * alStack_b8[lVar15];
                            lVar15 = lVar15 + 1;
                          } while ((int)uVar10 != lVar15);
                        }
                        anynul = 0;
                        if (local_23c != -0x20) {
                          if (bVar9) {
                            ffgsvd(local_248,1,uVar10,naxes,fpixel,lpixel,local_118,
                                   -9.1191291391491e-36,local_250,&anynul,status);
                            goto LAB_001c6d45;
                          }
                          if (bVar6) {
                            ffgsvk(local_248,1,uVar10,naxes,fpixel,lpixel,local_118,0,
                                   (int *)local_250,&anynul,status);
                            goto LAB_001c6d45;
                          }
                          if (bVar7) {
                            ffgsvi(local_248,1,uVar10,naxes,fpixel,lpixel,local_118,0,
                                   (short *)local_250,&anynul,status);
                            goto LAB_001c6d45;
                          }
                          if (bVar8) {
                            ffgsvb(local_248,1,uVar10,naxes,fpixel,lpixel,local_118,'\0',
                                   (uchar *)local_250,&anynul,status);
                            goto LAB_001c6d45;
                          }
                          err_message = "Error bad datatype of image tile to compress";
LAB_001c6f61:
                          ffpmsg(err_message);
                          free(local_250);
                          goto LAB_001c6f70;
                        }
                        ffgsve(local_248,1,uVar10,naxes,fpixel,lpixel,local_118,-9.11912e-36,
                               (float *)local_250,&anynul,status);
LAB_001c6d45:
                        if (*status == 0) {
                          outfptr = (fitsfile *)0x1;
                          tileny = (FITSfile *)0x1;
                          if (0 < (int)uVar10) {
                            tileny = (FITSfile *)0x1;
                            lVar15 = 0;
                            uVar12 = 0;
                            do {
                              lVar13 = lpixel[uVar12] - fpixel[uVar12];
                              if (lVar13 != 0 && fpixel[uVar12] <= lpixel[uVar12]) {
                                lVar13 = lVar13 + 1;
                                lVar14 = lVar13;
                                if (lVar15 == 0) {
                                  lVar14 = 1;
                                  lVar15 = lVar13;
                                }
                                tileny = (FITSfile *)((long)tileny * lVar14);
                              }
                              uVar12 = uVar12 + 1;
                            } while (uVar10 != uVar12);
                            outfptr = (fitsfile *)(lVar15 + (ulong)(lVar15 == 0));
                          }
                        }
                        if (anynul == 0 || local_23c != -0x20) {
                          if (bVar9 && anynul != 0) {
                            iVar18 = 0x52;
                            nullflagval = &dblnull;
                            goto LAB_001c6e06;
                          }
                          nullflagval = &dummy;
                          iVar19 = 0;
                          iVar18 = local_258;
                        }
                        else {
                          iVar18 = 0x2a;
                          nullflagval = (double *)&fltnull;
LAB_001c6e06:
                          iVar19 = 1;
                        }
                        imcomp_compress_tile
                                  (local_238,local_230,iVar18,local_250,lVar11,(long)outfptr,
                                   (long)tileny,iVar19,nullflagval,status);
                        iVar18 = *status;
                        if (0 < iVar18) {
                          err_message = "Error writing compressed image to table";
                          goto LAB_001c6f61;
                        }
                        local_228 = local_228 & 0xffffffff;
                        if (anynul != 0) {
                          local_228 = 1;
                        }
                        local_230 = local_230 + 1;
                        lVar13 = naxes[0];
                        lVar11 = naxes[1];
                        lVar15 = lVar16;
                      } while (lVar16 <= naxes[0]);
                    }
                    lVar15 = naxes[2];
                    lVar16 = lVar4;
                  } while (lVar4 <= lVar11);
                }
                lVar13 = naxes[3];
                lVar16 = lVar3;
              } while (lVar3 <= lVar15);
            }
            lVar11 = naxes[4];
            lVar16 = lVar2;
          } while (lVar2 <= lVar13);
        }
        lVar15 = naxes[5];
        lVar16 = lVar1;
      } while (lVar1 <= lVar11);
    }
    lVar13 = lVar17;
    if (lVar15 < lVar17) {
      free(local_250);
      fptr = local_238;
      if ((int)local_228 == 0) {
        return iVar18;
      }
      ffgcrd(local_238,"ZCMPTYPE",card,status);
      ffikyj(fptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",status);
LAB_001c6f70:
      return *status;
    }
  } while( true );
}

Assistant:

int imcomp_compress_image (fitsfile *infptr, fitsfile *outfptr, int *status)

/* This routine does the following:
        - reads an image one tile at a time
        - if it is a float or double image, then it tries to quantize the pixels
          into scaled integers.
        - it then compressess the integer pixels, or if the it was not
	  possible to quantize the floating point pixels, then it losslessly
	  compresses them with gzip
	- writes the compressed byte stream to the output FITS file
*/
{
    double *tiledata;
    int anynul, gotnulls = 0, datatype;
    long ii, row;
    int naxis;
    double dummy = 0., dblnull = DOUBLENULLVALUE;
    float fltnull = FLOATNULLVALUE;
    long maxtilelen, tilelen, incre[] = {1, 1, 1, 1, 1, 1};
    long naxes[MAX_COMPRESS_DIM], fpixel[MAX_COMPRESS_DIM];
    long lpixel[MAX_COMPRESS_DIM], tile[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM];
    long i0, i1, i2, i3, i4, i5, trowsize, ntrows;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    maxtilelen = (outfptr->Fptr)->maxtilelen;

    /* 
     Allocate buffer to hold 1 tile of data; size depends on which compression 
     algorithm is used:

      Rice and GZIP will compress byte, short, or int arrays without conversion.
      PLIO requires 4-byte int values, so byte and short arrays must be converted to int.
      HCompress internally converts byte or short values to ints, and
         converts int values to 8-byte longlong integers.
    */
    
    if ((outfptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        datatype = TFLOAT;

        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */
            tiledata = (double*) malloc (maxtilelen * 2 *sizeof (float));	
	} else {
            tiledata = (double*) malloc (maxtilelen * sizeof (float));
	}
    }
    else if ((outfptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        datatype = TDOUBLE;
        tiledata = (double*) malloc (maxtilelen * sizeof (double));
    }
    else if ((outfptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
             (outfptr->Fptr)->compress_type == NOCOMPRESS) {
	    /* only need  buffer of I*2 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen * sizeof (short));	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == BYTE_IMG)
    {

        datatype = TBYTE;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2) {
	    /* only need  buffer of I*1 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen);	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */

            tiledata = (double*) malloc (maxtilelen * 2 * sizeof (int));	
	} else {
 	    /* only need  buffer of I*4 pixels for gzip, bzip2,  Rice, and PLIO */

            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else
    {
	ffpmsg("Bad image datatype. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }
    
    if (tiledata == NULL)
    {
	ffpmsg("Out of memory. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }

    /*  calculate size of tile in each dimension */
    naxis = (outfptr->Fptr)->zndim;
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        if (ii < naxis)
        {
             naxes[ii] = (outfptr->Fptr)->znaxis[ii];
             tilesize[ii] = (outfptr->Fptr)->tilesize[ii];
        }
        else
        {
            naxes[ii] = 1;
            tilesize[ii] = 1;
        }
    }
    row = 1;

    /* set up big loop over up to 6 dimensions */
    for (i5 = 1; i5 <= naxes[5]; i5 += tilesize[5])
    {
     fpixel[5] = i5;
     lpixel[5] = minvalue(i5 + tilesize[5] - 1, naxes[5]);
     tile[5] = lpixel[5] - fpixel[5] + 1;
     for (i4 = 1; i4 <= naxes[4]; i4 += tilesize[4])
     {
      fpixel[4] = i4;
      lpixel[4] = minvalue(i4 + tilesize[4] - 1, naxes[4]);
      tile[4] = lpixel[4] - fpixel[4] + 1;
      for (i3 = 1; i3 <= naxes[3]; i3 += tilesize[3])
      {
       fpixel[3] = i3;
       lpixel[3] = minvalue(i3 + tilesize[3] - 1, naxes[3]);
       tile[3] = lpixel[3] - fpixel[3] + 1;
       for (i2 = 1; i2 <= naxes[2]; i2 += tilesize[2])
       {
        fpixel[2] = i2;
        lpixel[2] = minvalue(i2 + tilesize[2] - 1, naxes[2]);
        tile[2] = lpixel[2] - fpixel[2] + 1;
        for (i1 = 1; i1 <= naxes[1]; i1 += tilesize[1])
        {
         fpixel[1] = i1;
         lpixel[1] = minvalue(i1 + tilesize[1] - 1, naxes[1]);
         tile[1] = lpixel[1] - fpixel[1] + 1;
         for (i0 = 1; i0 <= naxes[0]; i0 += tilesize[0])
         {
          fpixel[0] = i0;
          lpixel[0] = minvalue(i0 + tilesize[0] - 1, naxes[0]);
          tile[0] = lpixel[0] - fpixel[0] + 1;

          /* number of pixels in this tile */
          tilelen = tile[0];
          for (ii = 1; ii < naxis; ii++)
          {
             tilelen *= tile[ii];
          }

          /* read next tile of data from image */
	  anynul = 0;
          if (datatype == TFLOAT)
          {
              ffgsve(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  FLOATNULLVALUE, (float *) tiledata,  &anynul, status);
          }
          else if (datatype == TDOUBLE)
          {
              ffgsvd(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  DOUBLENULLVALUE, tiledata, &anynul, status);
          }
          else if (datatype == TINT)
          {
              ffgsvk(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (int *) tiledata,  &anynul, status);
          }
          else if (datatype == TSHORT)
          {
              ffgsvi(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (short *) tiledata,  &anynul, status);
          }
          else if (datatype == TBYTE)
          {
              ffgsvb(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (unsigned char *) tiledata,  &anynul, status);
          }
          else 
          {
              ffpmsg("Error bad datatype of image tile to compress");
              free(tiledata);
              return (*status);
          }

          /* now compress the tile, and write to row of binary table */
          /*   NOTE: we don't have to worry about the presence of null values in the
	       array if it is an integer array:  the null value is simply encoded
	       in the compressed array just like any other pixel value.  
	       
	       If it is a floating point array, then we need to check for null
	       only if the anynul parameter returned a true value when reading the tile
	  */
          
          /* Collapse sizes of higher dimension tiles into 2 dimensional
             equivalents needed by the quantizing algorithms for
             floating point types */
          fits_calc_tile_rows(lpixel, fpixel, naxis, &trowsize,
                            &ntrows, status);

          if (anynul && datatype == TFLOAT) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &fltnull, status);
          } else if (anynul && datatype == TDOUBLE) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &dblnull, status);
          } else {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 0, &dummy, status);
          }

          /* set flag if we found any null values */
          if (anynul)
              gotnulls = 1;

          /* check for any error in the previous operations */
          if (*status > 0)
          {
              ffpmsg("Error writing compressed image to table");
              free(tiledata);
              return (*status);
          }

	  row++;
         }
        }
       }
      }
     }
    }

    free (tiledata);  /* finished with this buffer */

    /* insert ZBLANK keyword if necessary; only for TFLOAT or TDOUBLE images */
    if (gotnulls)
    {
          ffgcrd(outfptr, "ZCMPTYPE", card, status);
          ffikyj(outfptr, "ZBLANK", COMPRESS_NULL_VALUE, 
             "null value in the compressed integer array", status);
    }

    return (*status);
}